

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t archive_read_format_tar_skip(archive_read *a)

{
  void *pvVar1;
  undefined8 *__ptr;
  wchar_t wVar2;
  int64_t iVar3;
  
  pvVar1 = a->format->data;
  iVar3 = __archive_read_consume
                    (a,*(long *)((long)pvVar1 + 0x120) + *(long *)((long)pvVar1 + 0x110) +
                       *(long *)((long)pvVar1 + 0x128));
  if (iVar3 < 0) {
    wVar2 = L'\xffffffe2';
  }
  else {
    *(undefined8 *)((long)pvVar1 + 0x110) = 0;
    *(undefined8 *)((long)pvVar1 + 0x120) = 0;
    *(undefined8 *)((long)pvVar1 + 0x128) = 0;
    while (__ptr = *(undefined8 **)((long)pvVar1 + 0x138), __ptr != (undefined8 *)0x0) {
      *(undefined8 *)((long)pvVar1 + 0x138) = *__ptr;
      free(__ptr);
    }
    *(undefined8 *)((long)pvVar1 + 0x140) = 0;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

static int
archive_read_format_tar_skip(struct archive_read *a)
{
	int64_t bytes_skipped;
	struct tar* tar;

	tar = (struct tar *)(a->format->data);

	bytes_skipped = __archive_read_consume(a,
	    tar->entry_bytes_remaining + tar->entry_padding +
	    tar->entry_bytes_unconsumed);
	if (bytes_skipped < 0)
		return (ARCHIVE_FATAL);

	tar->entry_bytes_remaining = 0;
	tar->entry_bytes_unconsumed = 0;
	tar->entry_padding = 0;

	/* Free the sparse list. */
	gnu_clear_sparse_list(tar);

	return (ARCHIVE_OK);
}